

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O3

WordType llvm::APInt::tcSubtractPart(WordType *dst,WordType src,uint parts)

{
  WordType *pWVar1;
  ulong uVar2;
  WordType WVar3;
  ulong uVar4;
  
  if (parts == 0) {
    return 1;
  }
  uVar2 = *dst;
  *dst = *dst - src;
  if (src <= uVar2) {
    return 0;
  }
  uVar2 = 1;
  do {
    uVar4 = uVar2;
    if (parts == uVar4) break;
    pWVar1 = dst + uVar4;
    WVar3 = *pWVar1;
    *pWVar1 = *pWVar1 - 1;
    uVar2 = uVar4 + 1;
  } while (WVar3 == 0);
  return (ulong)(parts <= uVar4);
}

Assistant:

APInt::WordType APInt::tcSubtractPart(WordType *dst, WordType src,
                                      unsigned parts) {
  for (unsigned i = 0; i < parts; ++i) {
    WordType Dst = dst[i];
    dst[i] -= src;
    if (src <= Dst)
      return 0; // No need to borrow so exit early.
    src = 1; // We have to "borrow 1" from next "word"
  }

  return 1;
}